

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.c
# Opt level: O2

int aom_reader_init(aom_reader *r,uint8_t *buffer,size_t size)

{
  if (buffer != (uint8_t *)0x0 || size == 0) {
    r->buffer_end = buffer + size;
    r->buffer = buffer;
    od_ec_dec_init(&r->ec,buffer,(uint32_t)size);
    return 0;
  }
  return 1;
}

Assistant:

int aom_reader_init(aom_reader *r, const uint8_t *buffer, size_t size) {
  if (size && !buffer) {
    return 1;
  }
  r->buffer_end = buffer + size;
  r->buffer = buffer;
  od_ec_dec_init(&r->ec, buffer, (uint32_t)size);
#if CONFIG_ACCOUNTING
  r->accounting = NULL;
#endif
  return 0;
}